

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppModel.cpp
# Opt level: O2

string * __thiscall hiberlite::Scope::full_abi_cxx11_(string *__return_storage_ptr__,Scope *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&bStack_88,(string *)&this->_prefix);
  std::__cxx11::string::~string((string *)&bStack_88);
  if (bStack_88._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)this);
    std::operator+(&bStack_88,&local_48,"_");
    std::__cxx11::string::string((string *)&local_68,(string *)&this->_prefix);
    std::operator+(__return_storage_ptr__,&bStack_88,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&bStack_88);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Scope::full()
{
	if(prefix().size())
		return table()+"_"+prefix();
	else
		return table();
}